

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseAddExpr(Parser *this)

{
  TokenType tok;
  pointer pcVar1;
  _Alloc_hider _Var2;
  pointer in_RAX;
  pointer pcVar3;
  pointer *__ptr_1;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  _Alloc_hider local_38;
  
  local_38._M_p = in_RAX;
  parseMulExpr(this);
  tok = (in_RSI->m_currToken).type;
  while ((tok & ~LeftBrace) == Plus) {
    eatToken(in_RSI,tok);
    parseMulExpr((Parser *)&stack0xffffffffffffffc8);
    pcVar3 = (pointer)operator_new(0x20);
    _Var2._M_p = local_38._M_p;
    pcVar1 = (this->m_lexer).m_input._M_dataplus._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
    local_38._M_p = (pointer)0x0;
    *(undefined ***)pcVar3 = &PTR__BinaryExpr_00182a48;
    *(TokenType *)(pcVar3 + 8) = tok;
    *(pointer *)(pcVar3 + 0x10) = pcVar1;
    *(pointer *)(pcVar3 + 0x18) = _Var2._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar3;
    tok = (in_RSI->m_currToken).type;
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseAddExpr() {
    std::unique_ptr<AST::Expr> expr = parseMulExpr();
    while (m_currToken.type == TokenType::Plus || m_currToken.type == TokenType::Minus) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        std::unique_ptr<AST::Expr> right = parseMulExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}